

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tinsert(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  ulong n;
  ulong n_00;
  
  checktab(L,1,7);
  lVar2 = luaL_len(L,1);
  n_00 = lVar2 + 1;
  iVar1 = lua_gettop(L);
  n = n_00;
  if (iVar1 != 2) {
    if (iVar1 != 3) {
      iVar1 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar1;
    }
    n = luaL_checkinteger(L,2);
    if (n_00 <= n - 1) {
      luaL_argerror(L,2,"position out of bounds");
    }
    while ((long)n < (long)n_00) {
      lua_geti(L,1,n_00 - 1);
      lua_seti(L,1,n_00);
      n_00 = n_00 - 1;
    }
  }
  lua_seti(L,1,n);
  return 0;
}

Assistant:

static int tinsert (lua_State *L) {
  lua_Integer pos;  /* where to insert new element */
  lua_Integer e = aux_getn(L, 1, TAB_RW);
  e = luaL_intop(+, e, 1);  /* first empty element */
  switch (lua_gettop(L)) {
    case 2: {  /* called with only 2 arguments */
      pos = e;  /* insert new element at the end */
      break;
    }
    case 3: {
      lua_Integer i;
      pos = luaL_checkinteger(L, 2);  /* 2nd argument is the position */
      /* check whether 'pos' is in [1, e] */
      luaL_argcheck(L, (lua_Unsigned)pos - 1u < (lua_Unsigned)e, 2,
                       "position out of bounds");
      for (i = e; i > pos; i--) {  /* move up elements */
        lua_geti(L, 1, i - 1);
        lua_seti(L, 1, i);  /* t[i] = t[i - 1] */
      }
      break;
    }
    default: {
      return luaL_error(L, "wrong number of arguments to 'insert'");
    }
  }
  lua_seti(L, 1, pos);  /* t[pos] = v */
  return 0;
}